

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

void mpack_tree_init_stream
               (mpack_tree_t *tree,mpack_tree_read_t read_fn,void *context,size_t max_message_size,
               size_t max_message_nodes)

{
  size_t max_message_nodes_local;
  size_t max_message_size_local;
  void *context_local;
  mpack_tree_read_t read_fn_local;
  mpack_tree_t *tree_local;
  
  mpack_tree_init_clear(tree);
  tree->read_fn = read_fn;
  tree->context = context;
  tree->max_size = max_message_size;
  tree->max_nodes = max_message_nodes;
  return;
}

Assistant:

void mpack_tree_init_stream(mpack_tree_t* tree, mpack_tree_read_t read_fn, void* context,
        size_t max_message_size, size_t max_message_nodes) {
    mpack_tree_init_clear(tree);

    tree->read_fn = read_fn;
    tree->context = context;
    tree->max_size = max_message_size;
    tree->max_nodes = max_message_nodes;

    mpack_log("===========================\n");
    mpack_log("initializing tree with stream, max size %i max nodes %i\n",
            (int)max_message_size, (int)max_message_nodes);
}